

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

Gia_Man_t * Gia_ManDupPosAndPropagateInit(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  Gia_ManHashAlloc(p_00);
  local_2c = 1;
  while( true ) {
    bVar7 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar7 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsPi(p,pGStack_28);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi(pGStack_28);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsPo(p,pGStack_28);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjFanin0Copy(pGStack_28);
            Gia_ManAppendCo(p_00,iVar1);
          }
        }
        else {
          pGStack_28->Value = 0;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(p_00);
        pGStack_28->Value = uVar2;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iVar3 = Gia_ObjFanin1Copy(pGStack_28);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
      pGStack_28->Value = uVar2;
    }
    local_2c = local_2c + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManPiNum(p);
  iVar3 = Gia_ManPiNum(p_00);
  if (iVar1 != iVar3) {
    __assert_fail("Gia_ManPiNum(p) == Gia_ManPiNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                  ,0xb4,"Gia_Man_t *Gia_ManDupPosAndPropagateInit(Gia_Man_t *)");
  }
  iVar1 = Gia_ManPoNum(p);
  iVar3 = Gia_ManPoNum(p_00);
  if (iVar1 != iVar3) {
    __assert_fail("Gia_ManPoNum(p) == Gia_ManPoNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                  ,0xb5,"Gia_Man_t *Gia_ManDupPosAndPropagateInit(Gia_Man_t *)");
  }
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupPosAndPropagateInit( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsPi(p, pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = 0;
        else if ( Gia_ObjIsPo(p, pObj) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    assert( Gia_ManPiNum(p) == Gia_ManPiNum(pNew) );
    assert( Gia_ManPoNum(p) == Gia_ManPoNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}